

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btInternalEdgeUtility.cpp
# Opt level: O0

bool btClampNormal(btVector3 *edge,btVector3 *tri_normal_org,btVector3 *localContactNormalOnB,
                  btScalar correctedEdgeAngle,btVector3 *clampedLocalNormal)

{
  btVector3 *pbVar1;
  undefined8 *in_RCX;
  undefined8 *in_RSI;
  float in_XMM0_Da;
  btVector3 bVar2;
  btQuaternion rotation_1;
  btScalar diffAngle_1;
  btQuaternion rotation;
  btScalar diffAngle;
  btScalar curAngle;
  btVector3 edgeCross;
  btVector3 tri_normal;
  btVector3 *in_stack_fffffffffffffed0;
  btVector3 *in_stack_fffffffffffffed8;
  btMatrix3x3 *in_stack_fffffffffffffee0;
  btMatrix3x3 *m;
  btQuaternion *in_stack_fffffffffffffee8;
  btMatrix3x3 *in_stack_fffffffffffffef0;
  btVector3 *in_stack_ffffffffffffff00;
  btVector3 *in_stack_ffffffffffffff08;
  btVector3 *in_stack_ffffffffffffff10;
  btMatrix3x3 local_c0;
  btVector3 local_80;
  float local_70;
  btScalar local_6c;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 *local_30;
  float local_24;
  bool local_1;
  
  local_48 = *in_RSI;
  uStack_40 = in_RSI[1];
  local_30 = in_RCX;
  local_24 = in_XMM0_Da;
  bVar2 = btVector3::cross(in_stack_fffffffffffffee0->m_el,in_stack_fffffffffffffed8);
  local_60 = bVar2.m_floats._8_8_;
  local_68 = bVar2.m_floats._0_8_;
  pbVar1 = btVector3::normalize(in_stack_fffffffffffffed0);
  local_58 = *(undefined8 *)pbVar1->m_floats;
  local_50 = *(undefined8 *)(pbVar1->m_floats + 2);
  local_6c = btGetAngle(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                        in_stack_ffffffffffffff00);
  if ((0.0 <= local_24) || (local_24 <= local_6c)) {
    if ((local_24 < 0.0) || (local_6c <= local_24)) {
      local_1 = false;
    }
    else {
      btQuaternion::btQuaternion
                ((btQuaternion *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                 in_stack_fffffffffffffed0->m_floats);
      btMatrix3x3::btMatrix3x3(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      bVar2 = operator*(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      *local_30 = bVar2.m_floats._0_8_;
      local_30[1] = bVar2.m_floats._8_8_;
      local_1 = true;
    }
  }
  else {
    local_70 = local_24 - local_6c;
    pbVar1 = &local_80;
    btQuaternion::btQuaternion
              ((btQuaternion *)in_stack_fffffffffffffee0,pbVar1,in_stack_fffffffffffffed0->m_floats)
    ;
    m = &local_c0;
    btMatrix3x3::btMatrix3x3(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    bVar2 = operator*(m,pbVar1);
    *local_30 = bVar2.m_floats._0_8_;
    local_30[1] = bVar2.m_floats._8_8_;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool	btClampNormal(const btVector3& edge,const btVector3& tri_normal_org,const btVector3& localContactNormalOnB, btScalar correctedEdgeAngle, btVector3 & clampedLocalNormal)
{
	btVector3 tri_normal = tri_normal_org;
	//we only have a local triangle normal, not a local contact normal -> only normal in world space...
	//either compute the current angle all in local space, or all in world space

	btVector3 edgeCross = edge.cross(tri_normal).normalize();
	btScalar curAngle = btGetAngle(edgeCross,tri_normal,localContactNormalOnB);

	if (correctedEdgeAngle<0)
	{
		if (curAngle < correctedEdgeAngle)
		{
			btScalar diffAngle = correctedEdgeAngle-curAngle;
			btQuaternion rotation(edge,diffAngle );
			clampedLocalNormal = btMatrix3x3(rotation)*localContactNormalOnB;
			return true;
		}
	}

	if (correctedEdgeAngle>=0)
	{
		if (curAngle > correctedEdgeAngle)
		{
			btScalar diffAngle = correctedEdgeAngle-curAngle;
			btQuaternion rotation(edge,diffAngle );
			clampedLocalNormal = btMatrix3x3(rotation)*localContactNormalOnB;
			return true;
		}
	}
	return false;
}